

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trsort.c
# Opt level: O0

void trsort64(saidx64_t *ISA,saidx64_t *SA,saidx64_t n,saidx64_t depth)

{
  long lVar1;
  saint_t sVar2;
  long in_RCX;
  saidx64_t in_RDX;
  long *in_RSI;
  long in_RDI;
  saidx64_t unsorted;
  saidx64_t skip;
  saidx64_t t;
  trbudget_t_conflict budget;
  saidx64_t *last;
  saidx64_t *first;
  saidx64_t *ISAd;
  trbudget_t_conflict *in_stack_00000be8;
  saidx64_t *in_stack_00000bf0;
  saidx64_t *in_stack_00000bf8;
  saidx64_t *in_stack_00000c00;
  saidx64_t *in_stack_00000c08;
  saidx64_t *in_stack_00000c10;
  long local_70;
  long local_68;
  trbudget_t_conflict local_58;
  long *local_38;
  long *local_30;
  long local_28;
  long local_20;
  saidx64_t local_18;
  long *local_10;
  long local_8;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  sVar2 = tr_ilg(in_RDX);
  trbudget_init(&local_58,(long)((sVar2 << 1) / 3),local_18);
  local_28 = local_8 + local_20 * 8;
  while( true ) {
    if (*local_10 <= -local_18) {
      return;
    }
    local_30 = local_10;
    local_68 = 0;
    local_70 = 0;
    do {
      lVar1 = *local_30;
      if (lVar1 < 0) {
        local_30 = local_30 + -lVar1;
        local_68 = lVar1 + local_68;
      }
      else {
        if (local_68 != 0) {
          local_30[local_68] = local_68;
          local_68 = 0;
        }
        local_38 = local_10 + *(long *)(local_8 + lVar1 * 8) + 1;
        if ((long)local_38 - (long)local_30 >> 3 < 2) {
          if ((long)local_38 - (long)local_30 >> 3 == 1) {
            local_68 = -1;
          }
        }
        else {
          local_58.count = 0;
          tr_introsort(in_stack_00000c10,in_stack_00000c08,in_stack_00000c00,in_stack_00000bf8,
                       in_stack_00000bf0,in_stack_00000be8);
          if (local_58.count == 0) {
            local_68 = (long)local_30 - (long)local_38 >> 3;
          }
          else {
            local_70 = local_58.count + local_70;
          }
        }
        local_30 = local_38;
      }
    } while (local_30 < local_10 + local_18);
    if (local_68 != 0) {
      local_30[local_68] = local_68;
    }
    if (local_70 == 0) break;
    local_28 = (local_28 - local_8 >> 3) * 8 + local_28;
  }
  return;
}

Assistant:

void
trsort(saidx_t *ISA, saidx_t *SA, saidx_t n, saidx_t depth) {
  saidx_t *ISAd;
  saidx_t *first, *last;
  trbudget_t budget;
  saidx_t t, skip, unsorted;

  trbudget_init(&budget, tr_ilg(n) * 2 / 3, n);
/*  trbudget_init(&budget, tr_ilg(n) * 3 / 4, n); */
  for(ISAd = ISA + depth; -n < *SA; ISAd += ISAd - ISA) {
    first = SA;
    skip = 0;
    unsorted = 0;
    do {
      if((t = *first) < 0) { first -= t; skip += t; }
      else {
        if(skip != 0) { *(first + skip) = skip; skip = 0; }
        last = SA + ISA[t] + 1;
        if(1 < (last - first)) {
          budget.count = 0;
          tr_introsort(ISA, ISAd, SA, first, last, &budget);
          if(budget.count != 0) { unsorted += budget.count; }
          else { skip = first - last; }
        } else if((last - first) == 1) {
          skip = -1;
        }
        first = last;
      }
    } while(first < (SA + n));
    if(skip != 0) { *(first + skip) = skip; }
    if(unsorted == 0) { break; }
  }
}